

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O0

void light_write_packet(light_pcapng_t *pcapng,light_packet_header *packet_header,
                       uint8_t *packet_data)

{
  light_boolean lVar1;
  undefined4 *__s;
  long lVar2;
  light_pcapng next_block;
  uint32_t *__ptr;
  void *in_RDX;
  long in_RSI;
  _light_pcapng_t *in_RDI;
  uint32_t *file_memory;
  size_t blocks_memory_size;
  light_option packet_comment_opt;
  light_pcapng packet_block_pcapng;
  uint64_t timestamp_usec;
  _light_enhanced_packet_block *epb;
  uint8_t *epb_memory;
  size_t option_size;
  light_pcapng iface_block_pcapng;
  _light_interface_description_block interface_block;
  light_pcapng blocks_to_write;
  size_t iface_id;
  void *x_ret_2;
  void *x_ret_1;
  void *x_ret;
  light_option local_98;
  light_pcapng_file_info *in_stack_ffffffffffffff78;
  void *buf;
  __fd_t in_stack_ffffffffffffff80;
  uint32_t *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  uint32_t block_type;
  light_pcapng in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffba;
  undefined4 in_stack_ffffffffffffffbc;
  light_pcapng size;
  light_pcapng pcapng_00;
  
  block_type = (uint32_t)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  if (in_RDI == (_light_pcapng_t *)0x0) {
    fprintf(_stderr,"NULL pointer ERROR at %s::%s::%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng_ext.c"
            ,"light_write_packet",0x1b0);
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"NULL pointer ERROR at %s::%s::%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng_ext.c"
            ,"light_write_packet",0x1b1);
  }
  else if (in_RDX == (void *)0x0) {
    fprintf(_stderr,"NULL pointer ERROR at %s::%s::%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng_ext.c"
            ,"light_write_packet",0x1b2);
  }
  else {
    lVar1 = __is_open_for_write(in_RDI);
    if (lVar1 == LIGHT_TRUE) {
      for (pcapng_00 = (light_pcapng)0x0;
          (pcapng_00 < (light_pcapng)in_RDI->file_info->interface_block_count &&
          (in_RDI->file_info->link_types[(long)pcapng_00] != *(uint16_t *)(in_RSI + 0x20)));
          pcapng_00 = (light_pcapng)((long)&pcapng_00->block_type + 1)) {
      }
      size = (light_pcapng)0x0;
      if ((light_pcapng)in_RDI->file_info->interface_block_count <= pcapng_00) {
        in_stack_ffffffffffffffb8 = *(undefined2 *)(in_RSI + 0x20);
        in_stack_ffffffffffffffba = 0;
        in_stack_ffffffffffffffbc = 0;
        in_stack_ffffffffffffffb0 =
             light_alloc_block(block_type,in_stack_ffffffffffffff88,
                               (uint32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20));
        light_add_block(in_RDI->pcapng_iter,in_stack_ffffffffffffffb0);
        in_RDI->pcapng_iter = in_stack_ffffffffffffffb0;
        size = in_stack_ffffffffffffffb0;
        __append_interface_block_to_file_info
                  ((light_pcapng)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      local_98 = (light_option)((ulong)*(uint *)(in_RSI + 0x18) + 0x14);
      if (((ulong)local_98 & 3) != 0) {
        local_98 = (light_option)((((ulong)local_98 >> 2) + 1) * 4);
      }
      __s = (undefined4 *)calloc(1,(size_t)local_98);
      memset(__s,0,(size_t)local_98);
      *__s = (int)pcapng_00;
      lVar2 = *(long *)(in_RSI + 8) * 1000000 + *(long *)(in_RSI + 0x10);
      __s[1] = (int)((ulong)lVar2 >> 0x20);
      __s[2] = (int)lVar2;
      __s[3] = *(undefined4 *)(in_RSI + 0x18);
      __s[4] = *(undefined4 *)(in_RSI + 0x1c);
      memcpy(__s + 5,in_RDX,(ulong)*(uint *)(in_RSI + 0x18));
      next_block = light_alloc_block((uint32_t)((ulong)lVar2 >> 0x20),in_stack_ffffffffffffff88,
                                     (uint32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20));
      light_add_block(in_RDI->pcapng_iter,next_block);
      free(__s);
      lVar1 = (light_boolean)((ulong)__s >> 0x20);
      if (*(short *)(in_RSI + 0x30) != 0) {
        in_stack_ffffffffffffff80 =
             (__fd_t)light_create_option((uint16_t)((ulong)in_stack_ffffffffffffff80 >> 0x30),
                                         (uint16_t)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                                         in_stack_ffffffffffffff78);
        light_add_option((light_pcapng)
                         CONCAT44(in_stack_ffffffffffffffbc,
                                  CONCAT22(in_stack_ffffffffffffffba,in_stack_ffffffffffffffb8)),
                         in_stack_ffffffffffffffb0,local_98,lVar1);
      }
      in_RDI->pcapng_iter = next_block;
      if (size == (light_pcapng)0x0) {
        size = next_block;
      }
      buf = (void *)0x0;
      __ptr = light_pcapng_to_memory(pcapng_00,(size_t *)size);
      light_write(in_stack_ffffffffffffff80,buf,(size_t)__ptr);
      free(__ptr);
    }
    else {
      fprintf(_stderr,"ERROR at %s::%s::%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng_ext.c"
              ,"light_write_packet",0x1b3,"file not open for writing");
    }
  }
  return;
}

Assistant:

void light_write_packet(light_pcapng_t *pcapng, const light_packet_header *packet_header, const uint8_t *packet_data)
{
	DCHECK_NULLP(pcapng, return);
	DCHECK_NULLP(packet_header, return);
	DCHECK_NULLP(packet_data, return);
	DCHECK_ASSERT_EXP(__is_open_for_write(pcapng) == LIGHT_TRUE, "file not open for writing", return);

	size_t iface_id = 0;
	for (iface_id = 0; iface_id < pcapng->file_info->interface_block_count; iface_id++)
	{
		if (pcapng->file_info->link_types[iface_id] == packet_header->data_link)
			break;
	}

	light_pcapng blocks_to_write = NULL;

	if (iface_id >= pcapng->file_info->interface_block_count)
	{
		struct _light_interface_description_block interface_block;
		interface_block.link_type = packet_header->data_link;
		interface_block.reserved = 0;
		interface_block.snapshot_length = 0;

		light_pcapng iface_block_pcapng = light_alloc_block(LIGHT_INTERFACE_BLOCK, (const uint32_t*)&interface_block, sizeof(struct _light_interface_description_block)+3*sizeof(uint32_t));
		light_add_block(pcapng->pcapng_iter, iface_block_pcapng);
		pcapng->pcapng_iter = iface_block_pcapng;

		blocks_to_write = iface_block_pcapng;
		__append_interface_block_to_file_info(iface_block_pcapng, pcapng->file_info);
	}

	size_t option_size = sizeof(struct _light_enhanced_packet_block) + packet_header->captured_length;
	PADD32(option_size, &option_size);
	uint8_t *epb_memory = calloc(1, option_size);
	memset(epb_memory, 0, option_size);
	struct _light_enhanced_packet_block *epb = (struct _light_enhanced_packet_block *)epb_memory;
	epb->interface_id = iface_id;
	uint64_t timestamp_usec = (uint64_t)packet_header->timestamp.tv_sec * (uint64_t)1000000 + (uint64_t)packet_header->timestamp.tv_usec;
	epb->timestamp_high = timestamp_usec >> 32;
	epb->timestamp_low = timestamp_usec & 0xFFFFFFFF;
	epb->capture_packet_length = packet_header->captured_length;
	epb->original_capture_length = packet_header->original_length;

	memcpy(epb->packet_data, packet_data, packet_header->captured_length);

//	int i = 0;
//
//	for (i = 0; i < packet_header->captured_length; i++)
//	{
//		if (i % 4 == 0)
//			printf("  ");
//
//		printf("0x%X ", packet_data[i]);
//	}
//
//	printf("\n\n\n");
//
//	for (i = 0; i < sizeof(struct _light_enhanced_packet_block) + packet_header->captured_length; i++)
//	{
//		if (i % 4 == 0)
//			printf("  ");
//
//		printf("0x%X ", epb_memory[i]);
//	}


	light_pcapng packet_block_pcapng = light_alloc_block(LIGHT_ENHANCED_PACKET_BLOCK, (const uint32_t*)epb_memory, option_size+3*sizeof(uint32_t));
	light_add_block(pcapng->pcapng_iter, packet_block_pcapng);
	free(epb_memory);

	if (packet_header->comment_length > 0)
	{
		light_option packet_comment_opt = light_create_option(LIGHT_OPTION_COMMENT, packet_header->comment_length, packet_header->comment);
		light_add_option(NULL, packet_block_pcapng, packet_comment_opt, LIGHT_FALSE);
	}

	pcapng->pcapng_iter = packet_block_pcapng;

	if (blocks_to_write == NULL)
		blocks_to_write = packet_block_pcapng;

	size_t blocks_memory_size = 0;
	uint32_t *file_memory = light_pcapng_to_memory(blocks_to_write, &blocks_memory_size);
	light_write(pcapng->file, file_memory, blocks_memory_size);
	free(file_memory);
}